

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O0

void __thiscall s2coding::StringVectorEncoder::Encode(StringVectorEncoder *this,Encoder *encoder)

{
  Encoder *pEVar1;
  unsigned_long_long *puVar2;
  unsigned_long_long *puVar3;
  size_type sVar4;
  size_t sVar5;
  char *src;
  Encoder *in_RCX;
  Span<const_unsigned_long_long> v;
  Span<unsigned_long_long> local_40;
  s2coding *local_30;
  pointer local_28;
  size_t local_20;
  Encoder *local_18;
  Encoder *encoder_local;
  StringVectorEncoder *this_local;
  
  local_18 = encoder;
  encoder_local = (Encoder *)this;
  local_20 = Encoder::length(&this->data_);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->offsets_,&local_20);
  puVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::data
                     (&this->offsets_);
  puVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::data
                     (&this->offsets_);
  sVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                    (&this->offsets_);
  local_40 = absl::MakeSpan<unsigned_long_long>(puVar2 + 1,puVar3 + sVar4);
  absl::Span<unsigned_long_long_const>::
  Span<absl::Span<unsigned_long_long>,void,absl::Span<unsigned_long_long>>
            ((Span<unsigned_long_long_const> *)&local_30,&local_40);
  v.len_ = (size_type)local_18;
  v.ptr_ = local_28;
  EncodeUintVector<unsigned_long_long>(local_30,v,in_RCX);
  pEVar1 = local_18;
  sVar5 = Encoder::length(&this->data_);
  Encoder::Ensure(pEVar1,sVar5);
  pEVar1 = local_18;
  src = Encoder::base(&this->data_);
  sVar5 = Encoder::length(&this->data_);
  Encoder::putn(pEVar1,src,sVar5);
  return;
}

Assistant:

void StringVectorEncoder::Encode(Encoder* encoder) {
  offsets_.push_back(data_.length());
  // We don't encode the first element of "offsets_", which is always zero.
  EncodeUintVector<uint64>(
      MakeSpan(offsets_.data() + 1, offsets_.data() + offsets_.size()),
      encoder);
  encoder->Ensure(data_.length());
  encoder->putn(data_.base(), data_.length());
}